

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmcS.c
# Opt level: O1

void Bmcs_ManAddCnf(Bmcs_Man_t *p,satoko_t *pSat,Cnf_Dat_t *pCnf)

{
  int *lits;
  long lVar1;
  int iVar2;
  
  iVar2 = p->nSatVarsOld;
  if (iVar2 < p->nSatVars) {
    do {
      satoko_add_variable(pSat,'\0');
      iVar2 = iVar2 + 1;
    } while (iVar2 < p->nSatVars);
  }
  lVar1 = 0;
  do {
    if (pCnf->nClauses <= lVar1) {
      return;
    }
    lits = pCnf->pClauses[lVar1];
    iVar2 = satoko_add_clause(pSat,lits,
                              (int)((ulong)((long)pCnf->pClauses[lVar1 + 1] - (long)lits) >> 2));
    lVar1 = lVar1 + 1;
  } while (iVar2 != 0);
  __assert_fail("0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcBmcS.c"
                ,0x27b,"void Bmcs_ManAddCnf(Bmcs_Man_t *, satoko_t *, Cnf_Dat_t *)");
}

Assistant:

void Bmcs_ManAddCnf( Bmcs_Man_t * p, bmc_sat_solver * pSat, Cnf_Dat_t * pCnf )
{
    int i;
    for ( i = p->nSatVarsOld; i < p->nSatVars; i++ )
        bmc_sat_solver_addvar( pSat );
    for ( i = 0; i < pCnf->nClauses; i++ )
        if ( !bmc_sat_solver_addclause( pSat, pCnf->pClauses[i], pCnf->pClauses[i+1]-pCnf->pClauses[i] ) )
            assert( 0 );
}